

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleRowDown38_2_Box_C(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  int i;
  intptr_t stride;
  int dst_width_local;
  uint8_t *dst_ptr_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_ptr_local;
  
  dst_ptr_local = dst_ptr;
  src_ptr_local = src_ptr;
  for (i = 0; i < dst_width; i = i + 3) {
    *dst_ptr_local =
         (uint8_t)(((uint)*src_ptr_local + (uint)src_ptr_local[1] + (uint)src_ptr_local[2] +
                    (uint)src_ptr_local[src_stride] + (uint)src_ptr_local[src_stride + 1] +
                   (uint)src_ptr_local[src_stride + 2]) * 0x2aaa >> 0x10);
    dst_ptr_local[1] =
         (uint8_t)(((uint)src_ptr_local[3] + (uint)src_ptr_local[4] + (uint)src_ptr_local[5] +
                    (uint)src_ptr_local[src_stride + 3] + (uint)src_ptr_local[src_stride + 4] +
                   (uint)src_ptr_local[src_stride + 5]) * 0x2aaa >> 0x10);
    dst_ptr_local[2] =
         (uint8_t)(((uint)src_ptr_local[6] + (uint)src_ptr_local[7] +
                    (uint)src_ptr_local[src_stride + 6] + (uint)src_ptr_local[src_stride + 7]) *
                   0x4000 >> 0x10);
    src_ptr_local = src_ptr_local + 8;
    dst_ptr_local = dst_ptr_local + 3;
  }
  return;
}

Assistant:

void ScaleRowDown38_2_Box_C(const uint8_t* src_ptr,
                            ptrdiff_t src_stride,
                            uint8_t* dst_ptr,
                            int dst_width) {
  intptr_t stride = src_stride;
  int i;
  assert((dst_width % 3 == 0) && (dst_width > 0));
  for (i = 0; i < dst_width; i += 3) {
    dst_ptr[0] = (src_ptr[0] + src_ptr[1] + src_ptr[2] + src_ptr[stride + 0] +
                  src_ptr[stride + 1] + src_ptr[stride + 2]) *
                     (65536 / 6) >>
                 16;
    dst_ptr[1] = (src_ptr[3] + src_ptr[4] + src_ptr[5] + src_ptr[stride + 3] +
                  src_ptr[stride + 4] + src_ptr[stride + 5]) *
                     (65536 / 6) >>
                 16;
    dst_ptr[2] =
        (src_ptr[6] + src_ptr[7] + src_ptr[stride + 6] + src_ptr[stride + 7]) *
            (65536 / 4) >>
        16;
    src_ptr += 8;
    dst_ptr += 3;
  }
}